

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>::
emplace<QtGraphicsAnchorLayout::GraphPath_const&>
          (QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
           *this,AnchorVertex **key,GraphPath *args)

{
  long lVar1;
  bool bVar2;
  GraphPath *in_RDX;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> copy;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
  *in_stack_ffffffffffffff98;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
  *in_stack_ffffffffffffffa0;
  iterator *key_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_00 = in_RDI;
  bVar2 = QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::
          isDetached(in_stack_ffffffffffffffa0);
  if (bVar2) {
    bVar2 = QHashPrivate::
            Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
            ::shouldGrow(in_RSI->d);
    if (bVar2) {
      QtGraphicsAnchorLayout::GraphPath::GraphPath(in_RDX,(GraphPath *)in_stack_ffffffffffffff98);
      QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::
      emplace_helper<QtGraphicsAnchorLayout::GraphPath>
                (in_RSI,(AnchorVertex **)key_00,(GraphPath *)in_RDI);
      QtGraphicsAnchorLayout::GraphPath::~GraphPath(in_RDX);
    }
    else {
      emplace_helper<QtGraphicsAnchorLayout::GraphPath_const&>
                (in_RSI,(AnchorVertex **)key_00,(GraphPath *)in_RDI);
    }
  }
  else {
    QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::
    QMultiHash(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::detach
              (in_stack_ffffffffffffffa0);
    emplace_helper<QtGraphicsAnchorLayout::GraphPath_const&>
              (in_RSI,(AnchorVertex **)key_00,(GraphPath *)in_RDI);
    QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::
    ~QMultiHash(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return key_00;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }